

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_socket_impl::maybe_trigger_writeable_callback
          (utp_socket_impl *this,error_code *ec)

{
  bool bVar1;
  error_category *local_38;
  _func_int **local_28;
  error_code error_to_report;
  error_code *ec_local;
  utp_socket_impl *this_local;
  
  if (((this->m_writeable_handler & 1U) != 0) && ((*(ushort *)&this->field_0x21c >> 0xe & 1) == 0))
  {
    this->m_writeable_handler = false;
    error_to_report.cat_ = (error_category *)ec;
    bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
    if (bVar1) {
      local_38 = error_to_report.cat_;
    }
    else {
      local_38 = (error_category *)&this->m_error;
    }
    local_28 = local_38->_vptr_error_category;
    error_to_report._0_8_ = local_38->id_;
    utp_stream::on_writeable(this->m_userdata,(error_code *)&local_28);
  }
  return;
}

Assistant:

void utp_socket_impl::maybe_trigger_writeable_callback(error_code const& ec)
{
	INVARIANT_CHECK;

	if (m_writeable_handler == false) return;

	if (m_stalled) return;

	m_writeable_handler = false;
	error_code const error_to_report = ec ? ec : m_error;
	utp_stream::on_writeable(m_userdata, error_to_report);
}